

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TQualifier::makeTemporary(TQualifier *this)

{
  this->semanticName = (char *)0x0;
  *(ulong *)&this->field_0x8 = *(ulong *)&this->field_0x8 & 0xf80000141fff0000;
  clearLayout(this);
  this->spirvStorageClass = -1;
  this->spirvDecorate = (TSpirvDecorate *)0x0;
  this->field_0xf = this->field_0xf & 0xe7;
  return;
}

Assistant:

void makeTemporary()
    {
        semanticName = nullptr;
        storage = EvqTemporary;
        builtIn = EbvNone;
        clearInterstage();
        clearMemory();
        specConstant = false;
        nonUniform = false;
        nullInit = false;
        defaultBlock = false;
        clearLayout();
        spirvStorageClass = -1;
        spirvDecorate = nullptr;
        spirvByReference = false;
        spirvLiteral = false;
    }